

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O3

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::Sink
          (WindowDistinctAggregatorLocalState *this,DataChunk *sink_chunk,DataChunk *coll_chunk,
          idx_t input_idx,optional_ptr<duckdb::SelectionVector,_true> filter_sel,idx_t filtered)

{
  optional_ptr<duckdb::LocalSortState,_true> *this_00;
  DataChunk *this_01;
  DataChunk *this_02;
  data_ptr_t pdVar1;
  WindowAggregator *pWVar2;
  LocalSortState *this_03;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  reference other;
  reference pvVar5;
  const_reference pvVar6;
  reference other_00;
  optional_ptr<duckdb::LocalSortState,_true> oVar7;
  idx_t iVar8;
  type global_sort_state;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  size_type __n;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  optional_ptr<duckdb::SelectionVector,_true> local_38;
  
  iVar8 = sink_chunk->count;
  this_01 = &this->payload_chunk;
  local_38.ptr = filter_sel.ptr;
  DataChunk::Reset(this_01);
  other = vector<duckdb::Vector,_true>::operator[](&this_01->data,0);
  auVar4 = _DAT_01d9fb10;
  auVar3 = _DAT_01d9fb00;
  if (iVar8 != 0) {
    pdVar1 = other->data;
    uVar11 = iVar8 + 0x1fffffffffffffff;
    uVar9 = uVar11 & 0x1fffffffffffffff;
    auVar12._8_4_ = (int)uVar9;
    auVar12._0_8_ = uVar9;
    auVar12._12_4_ = (int)(uVar9 >> 0x20);
    lVar10 = 0;
    auVar12 = auVar12 ^ _DAT_01d9fb10;
    do {
      auVar13._8_4_ = (int)lVar10;
      auVar13._0_8_ = lVar10;
      auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar13 = (auVar13 | auVar3) ^ auVar4;
      if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                  auVar12._4_4_ < auVar13._4_4_) & 1)) {
        *(idx_t *)(pdVar1 + lVar10 * 8) = input_idx + lVar10;
      }
      if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
          auVar13._12_4_ <= auVar12._12_4_) {
        *(idx_t *)(pdVar1 + lVar10 * 8 + 8) = input_idx + lVar10 + 1;
      }
      lVar10 = lVar10 + 2;
    } while ((uVar9 - ((uint)uVar11 & 1)) + 2 != lVar10);
  }
  pWVar2 = (this->gastate->super_WindowAggregatorGlobalState).aggregator;
  if ((pWVar2->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pWVar2->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&(this->sort_chunk).data,__n);
      pvVar6 = vector<unsigned_long,_true>::operator[](&pWVar2->child_idx,__n);
      other_00 = vector<duckdb::Vector,_true>::operator[](&coll_chunk->data,*pvVar6);
      Vector::Reference(pvVar5,other_00);
      __n = __n + 1;
    } while (__n < (ulong)((long)(pWVar2->child_idx).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pWVar2->child_idx).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  this_02 = &this->sort_chunk;
  pvVar5 = vector<duckdb::Vector,_true>::back(&this_02->data);
  Vector::Reference(pvVar5,other);
  iVar8 = sink_chunk->count;
  (this->sort_chunk).count = iVar8;
  (this->payload_chunk).count = iVar8;
  if (filter_sel.ptr != (SelectionVector *)0x0) {
    optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_38);
    DataChunk::Slice(this_02,local_38.ptr,filtered);
    optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_38);
    DataChunk::Slice(this_01,local_38.ptr,filtered);
  }
  this_00 = &this->local_sort;
  if ((this->local_sort).ptr == (LocalSortState *)0x0) {
    oVar7 = WindowDistinctAggregatorGlobalState::InitializeLocalSort(this->gastate);
    (this->local_sort).ptr = oVar7.ptr;
  }
  optional_ptr<duckdb::LocalSortState,_true>::CheckValid(this_00);
  LocalSortState::SinkChunk((this->local_sort).ptr,this_02,this_01);
  optional_ptr<duckdb::LocalSortState,_true>::CheckValid(this_00);
  iVar8 = LocalSortState::SizeInBytes((this->local_sort).ptr);
  if (this->gastate->memory_per_thread < iVar8) {
    optional_ptr<duckdb::LocalSortState,_true>::CheckValid(this_00);
    this_03 = (this->local_sort).ptr;
    global_sort_state =
         unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
         operator*(&this->gastate->global_sort);
    LocalSortState::Sort(this_03,global_sort_state,true);
  }
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::Sink(DataChunk &sink_chunk, DataChunk &coll_chunk, idx_t input_idx,
                                              optional_ptr<SelectionVector> filter_sel, idx_t filtered) {
	//	3: 	for i ← 0 to in.size do
	//	4: 		sorted[i] ← (in[i], i)
	const auto count = sink_chunk.size();
	payload_chunk.Reset();
	auto &sorted_vec = payload_chunk.data[0];
	auto sorted = FlatVector::GetData<idx_t>(sorted_vec);
	std::iota(sorted, sorted + count, input_idx);

	// Our arguments are being fully materialised,
	// but we also need them as sort keys.
	auto &child_idx = gastate.aggregator.child_idx;
	for (column_t c = 0; c < child_idx.size(); ++c) {
		sort_chunk.data[c].Reference(coll_chunk.data[child_idx[c]]);
	}
	sort_chunk.data.back().Reference(sorted_vec);
	sort_chunk.SetCardinality(sink_chunk);
	payload_chunk.SetCardinality(sort_chunk);

	//	Apply FILTER clause, if any
	if (filter_sel) {
		sort_chunk.Slice(*filter_sel, filtered);
		payload_chunk.Slice(*filter_sel, filtered);
	}

	if (!local_sort) {
		local_sort = gastate.InitializeLocalSort();
	}

	local_sort->SinkChunk(sort_chunk, payload_chunk);

	if (local_sort->SizeInBytes() > gastate.memory_per_thread) {
		local_sort->Sort(*gastate.global_sort, true);
	}
}